

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mhash.h
# Opt level: O0

void mh_assoc_del(mh_assoc_t *h,mh_int_t x,void *arg)

{
  byte bVar1;
  void *arg_local;
  mh_int_t x_local;
  mh_assoc_t *h_local;
  
  if ((x != h->n_buckets) && (bVar1 = (byte)x, (h->b[x >> 4] & 1 << (bVar1 & 0xf)) != 0)) {
    h->b[x >> 4] = (1 << (bVar1 & 0xf) ^ 0xffffffffU) & h->b[x >> 4];
    h->size = h->size - 1;
    if ((h->b[x >> 4] & 1 << ((bVar1 & 0xf) + 0x10 & 0x1f)) == 0) {
      h->n_dirty = h->n_dirty - 1;
    }
    if (h->resize_position != 0) {
      mh_assoc_del_resize(h,x,arg);
    }
  }
  return;
}

Assistant:

static inline void
_mh(del)(struct _mh(t) *h, mh_int_t x,
	 mh_arg_t arg)
{
	if (x != h->n_buckets && mh_exist(h, x)) {
		mh_setfree(h, x);
		h->size--;
		if (!mh_dirty(h, x))
			h->n_dirty--;
#if MH_INCREMENTAL_RESIZE
		if (mh_unlikely(h->resize_position))
			_mh(del_resize)(h, x, arg);
#endif
	}
}